

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSimpleBroadphase.cpp
# Opt level: O0

void __thiscall btSimpleBroadphase::validate(btSimpleBroadphase *this)

{
  int j;
  int i;
  btSimpleBroadphase *this_local;
  
  for (i = 0; j = i, i < this->m_numHandles; i = i + 1) {
    do {
      j = j + 1;
    } while (j < this->m_numHandles);
  }
  return;
}

Assistant:

void	btSimpleBroadphase::validate()
{
	for (int i=0;i<m_numHandles;i++)
	{
		for (int j=i+1;j<m_numHandles;j++)
		{
			btAssert(&m_pHandles[i] != &m_pHandles[j]);
		}
	}
	
}